

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache.cpp
# Opt level: O0

void __thiscall QNetworkDiskCachePrivate::prepareLayout(QNetworkDiskCachePrivate *this)

{
  QString *pQVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  uint i;
  QString subdir;
  QString str;
  QDir helper;
  QStringBuilder<QString_&,_QString_&> *in_stack_ffffffffffffff58;
  uint local_88;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 local_38 [24];
  undefined8 local_20;
  _Optional_payload_base<QFlags<QFileDevice::Permission>_> local_18;
  _Optional_payload_base<QFlags<QFileDevice::Permission>_> local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x280a74);
  QDir::QDir((QDir *)&local_20,(QString *)local_38);
  QString::~QString((QString *)0x280a90);
  pQVar1 = in_RDI + 7;
  std::optional<QFlags<QFileDevice::Permission>_>::optional
            ((optional<QFlags<QFileDevice::Permission>_> *)&local_10);
  QDir::mkpath(&local_20,&(pQVar1->d).ptr,local_10);
  for (local_88 = 0; local_88 < 0x10; local_88 = local_88 + 1) {
    local_50 = 0xaaaaaaaaaaaaaaaa;
    local_48 = 0xaaaaaaaaaaaaaaaa;
    local_40 = 0xaaaaaaaaaaaaaaaa;
    QString::number((uint)&local_50,local_88);
    local_68 = 0xaaaaaaaaaaaaaaaa;
    local_60 = 0xaaaaaaaaaaaaaaaa;
    local_58 = 0xaaaaaaaaaaaaaaaa;
    ::operator+(in_RDI,(QString *)in_stack_ffffffffffffff58);
    ::QStringBuilder::operator_cast_to_QString(in_stack_ffffffffffffff58);
    std::optional<QFlags<QFileDevice::Permission>_>::optional
              ((optional<QFlags<QFileDevice::Permission>_> *)&local_18);
    QDir::mkdir(&local_20,&local_68,local_18);
    QString::~QString((QString *)0x280b95);
    QString::~QString((QString *)0x280b9f);
  }
  QDir::~QDir((QDir *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkDiskCachePrivate::prepareLayout()
{
    QDir helper;

    //Create directory and subdirectories 0-F
    helper.mkpath(dataDirectory);
    for (uint i = 0; i < 16 ; i++) {
        QString str = QString::number(i, 16);
        QString subdir = dataDirectory + str;
        helper.mkdir(subdir);
    }
}